

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O3

Type __thiscall QtPromise::resolve<QByteArray>(QtPromise *this,QByteArray *value)

{
  QSharedData *pQVar1;
  bool bVar2;
  undefined8 *puVar3;
  Data *extraout_RAX;
  PromiseData<QByteArray> *extraout_RDX;
  PromiseData<QByteArray> *extraout_RDX_00;
  PromiseData<QByteArray> *extraout_RDX_01;
  PromiseData<QByteArray> *extraout_RDX_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_> QVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> QVar5;
  Type TVar6;
  PromiseResolver<QByteArray> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> local_50;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> local_48;
  QPromise<QByteArray> local_40;
  
  *(undefined ***)this = &PTR__QPromiseBase_00154940;
  puVar3 = (undefined8 *)operator_new(0x68);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *puVar3 = &PTR__PromiseDataBase_001549c8;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar3 + 2),0);
  *(undefined1 *)(puVar3 + 3) = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  *puVar3 = &PTR__PromiseData_00154960;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  LOCK();
  *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
  UNLOCK();
  local_40.super_QPromiseBase<QByteArray>.m_d.d = *(PromiseData<QByteArray> **)(this + 8);
  if (local_40.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<QByteArray>.m_d.d)->
              super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40.super_QPromiseBase<QByteArray>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001548f8;
  QtPromisePrivate::PromiseResolver<QByteArray>::PromiseResolver
            ((PromiseResolver<QByteArray> *)&local_48,&local_40);
  local_40.super_QPromiseBase<QByteArray>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00154940;
  if (local_40.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0) {
    LOCK();
    pQVar1 = &((local_40.super_QPromiseBase<QByteArray>.m_d.d)->
              super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_40.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0)) {
      (*((local_40.super_QPromiseBase<QByteArray>.m_d.d)->
        super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (local_48.d == (Data *)0x0) {
    local_50.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_50.d = local_48.d;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar2 = false;
      QVar5.d = local_48.d;
      goto LAB_0011a4e8;
    }
  }
  bVar2 = true;
  QVar5.d = (Data *)0x0;
LAB_0011a4e8:
  QtPromisePrivate::PromiseResolver<QByteArray>::resolve<QByteArray>
            ((PromiseResolver<QByteArray> *)&local_50,value);
  QVar4.d = extraout_RDX;
  if (!bVar2) {
    LOCK();
    ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar5.d,0x10);
      QVar4.d = extraout_RDX_00;
    }
  }
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_50.d,0x10);
      QVar4.d = extraout_RDX_01;
    }
  }
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_48.d,0x10);
      local_48.d = extraout_RAX;
      QVar4.d = extraout_RDX_02;
    }
  }
  *(undefined ***)this = &PTR__QPromiseBase_001548f8;
  TVar6.super_QPromiseBase<QByteArray>.m_d.d = QVar4.d;
  TVar6.super_QPromiseBase<QByteArray>._vptr_QPromiseBase = (_func_int **)local_48.d;
  return (Type)TVar6.super_QPromiseBase<QByteArray>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}